

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O2

void __thiscall ON_Layer::DeletePerViewportPlotColor(ON_Layer *this,ON_UUID *viewport_id)

{
  bool bVar1;
  uint uVar2;
  ON__LayerExtensions *this_00;
  ON__LayerPerViewSettings *this_01;
  long lVar3;
  int i;
  ON__UINT8 *layer;
  undefined1 in_R9B;
  long lVar4;
  long lVar5;
  ON_UUID viewport_id_00;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_54;
  ON__UINT8 *local_50;
  ON_Layer *local_48;
  ON_SimpleArray<ON__LayerPerViewSettings> *local_40;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_34;
  
  bVar1 = ON_UuidIsNil(viewport_id);
  layer = &this->m_extension_bits;
  if (bVar1) {
    this_00 = ON__LayerExtensions::LayerExtensions(this,layer,false);
    if (this_00 == (ON__LayerExtensions *)0x0) {
      return;
    }
    local_40 = &this_00->m_vp_settings;
    i = (this_00->m_vp_settings).m_count;
    lVar3 = (long)i;
    lVar5 = lVar3 * 0x28;
    local_50 = layer;
    local_48 = this;
    while( true ) {
      i = i + -1;
      lVar4 = lVar5 + -0x28;
      bVar1 = lVar3 == 0;
      lVar3 = lVar3 + -1;
      if (bVar1) break;
      ON_Color::ON_Color((ON_Color *)&local_54,0xffffffff);
      *(anon_union_4_2_6147a14e_for_ON_Color_15 *)
       ((long)&((ON_Color *)(&(this_00->m_vp_settings).m_a[-1].m_viewport_id + 1))[1].field_0 +
       lVar5) = local_54;
      uVar2 = ON__LayerPerViewSettings::SettingsMask
                        ((ON__LayerPerViewSettings *)
                         ((this_00->m_vp_settings).m_a[-1].m_viewport_id.Data4 + lVar5 + -8));
      lVar5 = lVar4;
      if (uVar2 == 0) {
        ON_SimpleArray<ON__LayerPerViewSettings>::Remove(local_40,i);
      }
    }
    bVar1 = ON__LayerExtensions::IsEmpty(this_00);
    if (!bVar1) {
      return;
    }
    this_01 = (ON__LayerPerViewSettings *)0x0;
    layer = local_50;
    this = local_48;
  }
  else {
    viewport_id_00.Data4[0] = '\0';
    viewport_id_00.Data4[1] = '\0';
    viewport_id_00.Data4[2] = '\0';
    viewport_id_00.Data4[3] = '\0';
    viewport_id_00.Data4[4] = '\0';
    viewport_id_00.Data4[5] = '\0';
    viewport_id_00.Data4[6] = '\0';
    viewport_id_00.Data4[7] = '\0';
    viewport_id_00._0_8_ = *(ulong *)viewport_id->Data4;
    this_01 = ON__LayerExtensions::ViewportSettings
                        ((ON__LayerExtensions *)this,(ON_Layer *)layer,*(uchar **)viewport_id,
                         viewport_id_00,(bool)in_R9B);
    if (this_01 == (ON__LayerPerViewSettings *)0x0) {
      return;
    }
    ON_Color::ON_Color((ON_Color *)&local_34,0xffffffff);
    (this_01->m_plot_color).field_0 = local_34;
    uVar2 = ON__LayerPerViewSettings::SettingsMask(this_01);
    if (uVar2 != 0) {
      return;
    }
  }
  ON__LayerExtensions::DeleteViewportSettings(this,layer,this_01);
  return;
}

Assistant:

void ON_Layer::DeletePerViewportPlotColor( const ON_UUID& viewport_id )
{
  if ( ON_UuidIsNil(viewport_id) )
  {
    ON__LayerExtensions* ud = ON__LayerExtensions::LayerExtensions(*this,&m_extension_bits,false);
    if ( 0 != ud )
    {
      for ( int i = ud->m_vp_settings.Count(); i--; /*empty iterator*/ )
      {
        ud->m_vp_settings[i].m_plot_color = ON_UNSET_COLOR;
        if ( 0 == ud->m_vp_settings[i].SettingsMask() )
          ud->m_vp_settings.Remove(i);
      }
      if ( ud->IsEmpty() )
      {
        ON__LayerExtensions::DeleteViewportSettings( *this, &m_extension_bits, 0 );
        ud = 0;
      }
    }
  }
  else
  {
    ON__LayerPerViewSettings* vp_settings = ON__LayerExtensions::ViewportSettings( *this, &m_extension_bits, viewport_id, false );
    if (vp_settings) 
    {
      vp_settings->m_plot_color = ON_UNSET_COLOR;
      if ( 0 == vp_settings->SettingsMask() )
        ON__LayerExtensions::DeleteViewportSettings(*this,&m_extension_bits,vp_settings);
    }
  }
}